

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O2

void __thiscall YAML::EmitterState::EndedGroup(EmitterState *this,value type)

{
  pointer puVar1;
  Group *pGVar2;
  size_t sVar3;
  unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
  pFinishedGroup;
  _Head_base<0UL,_YAML::EmitterState::Group_*,_false> local_48;
  allocator local_39;
  string local_38;
  
  if ((this->m_groups).
      super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_groups).
      super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (type == Seq) {
      std::__cxx11::string::string
                ((string *)&local_38,"unexpected end sequence token",(allocator *)&local_48);
      SetError(this,&local_38);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_38,"unexpected end map token",(allocator *)&local_48);
      SetError(this,&local_38);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    if (this->m_hasTag == true) {
      std::__cxx11::string::string((string *)&local_38,"invalid tag",(allocator *)&local_48);
      SetError(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    if (this->m_hasAnchor == true) {
      std::__cxx11::string::string((string *)&local_38,"invalid anchor",(allocator *)&local_48);
      SetError(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    puVar1 = (this->m_groups).
             super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pGVar2 = puVar1[-1]._M_t.
             super___uniq_ptr_impl<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::EmitterState::Group_*,_std::default_delete<YAML::EmitterState::Group>_>
             .super__Head_base<0UL,_YAML::EmitterState::Group_*,_false>._M_head_impl;
    puVar1[-1]._M_t.
    super___uniq_ptr_impl<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
    ._M_t.
    super__Tuple_impl<0UL,_YAML::EmitterState::Group_*,_std::default_delete<YAML::EmitterState::Group>_>
    .super__Head_base<0UL,_YAML::EmitterState::Group_*,_false>._M_head_impl = (Group *)0x0;
    local_48._M_head_impl = pGVar2;
    std::
    vector<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
    ::pop_back(&this->m_groups);
    if (pGVar2->type == type) {
      std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>::
      ~unique_ptr((unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
                   *)&local_48);
      puVar1 = (this->m_groups).
               super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->m_groups).
          super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == puVar1) {
        sVar3 = 0;
      }
      else {
        sVar3 = (puVar1[-1]._M_t.
                 super___uniq_ptr_impl<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_YAML::EmitterState::Group_*,_std::default_delete<YAML::EmitterState::Group>_>
                 .super__Head_base<0UL,_YAML::EmitterState::Group_*,_false>._M_head_impl)->indent;
      }
      this->m_curIndent = this->m_curIndent - sVar3;
      SettingChanges::restore(&this->m_globalModifiedSettings);
      SettingChanges::clear(&this->m_modifiedSettings);
      this->m_hasAnchor = false;
      this->m_hasTag = false;
      this->m_hasNonContent = false;
    }
    else {
      std::__cxx11::string::string((string *)&local_38,"unmatched group tag",&local_39);
      SetError(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>::
      ~unique_ptr((unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
                   *)&local_48);
    }
  }
  return;
}

Assistant:

void EmitterState::EndedGroup(GroupType::value type) {
  if (m_groups.empty()) {
    if (type == GroupType::Seq) {
      return SetError(ErrorMsg::UNEXPECTED_END_SEQ);
    }
    return SetError(ErrorMsg::UNEXPECTED_END_MAP);
  }

  if (m_hasTag) {
    SetError(ErrorMsg::INVALID_TAG);
  }
  if (m_hasAnchor) {
    SetError(ErrorMsg::INVALID_ANCHOR);
  }

  // get rid of the current group
  {
    std::unique_ptr<Group> pFinishedGroup = std::move(m_groups.back());
    m_groups.pop_back();
    if (pFinishedGroup->type != type) {
      return SetError(ErrorMsg::UNMATCHED_GROUP_TAG);
    }
  }

  // reset old settings
  std::size_t lastIndent = (m_groups.empty() ? 0 : m_groups.back()->indent);
  assert(m_curIndent >= lastIndent);
  m_curIndent -= lastIndent;

  // some global settings that we changed may have been overridden
  // by a local setting we just popped, so we need to restore them
  m_globalModifiedSettings.restore();

  ClearModifiedSettings();
  m_hasAnchor = false;
  m_hasTag = false;
  m_hasNonContent = false;
}